

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

int32_t __thiscall icu_63::KeywordEnumeration::count(KeywordEnumeration *this,UErrorCode *param_1)

{
  size_t sVar1;
  int iVar2;
  char *__s;
  
  iVar2 = 0;
  for (__s = this->keywords; *__s != '\0'; __s = __s + sVar1 + 1) {
    iVar2 = iVar2 + 1;
    sVar1 = strlen(__s);
  }
  return iVar2;
}

Assistant:

virtual int32_t count(UErrorCode &/*status*/) const {
        char *kw = keywords;
        int32_t result = 0;
        while(*kw) {
            result++;
            kw += uprv_strlen(kw)+1;
        }
        return result;
    }